

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall pbrt::BasicScene::BasicScene(BasicScene *this)

{
  ThreadLocal<pstd::pmr::polymorphic_allocator<std::byte>_> *in_RDI;
  SceneEntity *in_stack_ffffffffffffff80;
  anon_class_1_0_00000001 *__f;
  function<pstd::pmr::polymorphic_allocator<std::byte>_()> *this_00;
  ThreadLocal<pstd::pmr::polymorphic_allocator<std::byte>_> *this_01;
  
  this_01 = in_RDI;
  SceneEntity::SceneEntity(in_stack_ffffffffffffff80);
  SceneEntity::SceneEntity(in_stack_ffffffffffffff80);
  std::vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>::vector
            ((vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *)0x521436);
  std::vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>::
  vector((vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_> *)
         0x52144c);
  __f = (anon_class_1_0_00000001 *)(in_RDI[3].mutex._M_impl._M_rwlock.__size + 8);
  std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::vector
            ((vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_> *)
             0x521462);
  this_00 = (function<pstd::pmr::polymorphic_allocator<std::byte>_()> *)
            ((long)&in_RDI[3].mutex._M_impl._M_rwlock + 0x20);
  std::
  map<pbrt::InternedString,_pbrt::InstanceDefinitionSceneEntity_*,_std::less<pbrt::InternedString>,_std::allocator<std::pair<const_pbrt::InternedString,_pbrt::InstanceDefinitionSceneEntity_*>_>_>
  ::map((map<pbrt::InternedString,_pbrt::InstanceDefinitionSceneEntity_*,_std::less<pbrt::InternedString>,_std::allocator<std::pair<const_pbrt::InternedString,_pbrt::InstanceDefinitionSceneEntity_*>_>_>
         *)0x521478);
  *(undefined8 *)&in_RDI[3].create.super__Function_base._M_functor = 0;
  std::function<pstd::pmr::polymorphic_allocator<std::byte>()>::
  function<pbrt::BasicScene::BasicScene()::__0,void>(this_00,__f);
  ThreadLocal<pstd::pmr::polymorphic_allocator<std::byte>_>::ThreadLocal
            (this_01,(function<pstd::pmr::polymorphic_allocator<std::byte>_()> *)in_RDI);
  std::function<pstd::pmr::polymorphic_allocator<std::byte>_()>::~function
            ((function<pstd::pmr::polymorphic_allocator<std::byte>_()> *)0x5214c2);
  Camera::Camera((Camera *)0x5214d3);
  Film::Film((Film *)0x5214e4);
  std::mutex::mutex((mutex *)0x5214f5);
  *(undefined8 *)((long)&in_RDI[5].mutex._M_impl._M_rwlock + 0x20) = 0;
  std::mutex::mutex((mutex *)0x521511);
  Sampler::Sampler((Sampler *)0x521522);
  std::mutex::mutex((mutex *)0x521533);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::Medium>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::Medium>_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::Medium>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::Medium>_*>_>_>
         *)0x521544);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Medium,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Medium>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Medium,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Medium>_>_>
         *)0x521555);
  std::mutex::mutex((mutex *)0x521566);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::Image_*>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::Image_*>_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::Image_*>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::Image_*>_*>_>_>
         *)0x521577);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Image_*>_>_>
         *)0x521588);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
            *)0x521599);
  std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::vector
            ((vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_> *)0x5215aa);
  std::mutex::mutex((mutex *)0x5215bb);
  std::vector<pbrt::AsyncJob<pbrt::Light>_*,_std::allocator<pbrt::AsyncJob<pbrt::Light>_*>_>::vector
            ((vector<pbrt::AsyncJob<pbrt::Light>_*,_std::allocator<pbrt::AsyncJob<pbrt::Light>_*>_>
              *)0x5215cc);
  std::mutex::mutex((mutex *)0x5215dd);
  std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::vector
            ((vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_> *)0x5215ee);
  std::mutex::mutex((mutex *)0x5215ff);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
            *)0x521610);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
            *)0x521621);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
            *)0x521632);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x521643);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::FloatTexture>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::FloatTexture>_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::FloatTexture>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::FloatTexture>_*>_>_>
         *)0x521654);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::SpectrumTexture>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::SpectrumTexture>_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::SpectrumTexture>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::AsyncJob<pbrt::SpectrumTexture>_*>_>_>
         *)0x521665);
  *(undefined4 *)((long)&in_RDI[0xc].mutex._M_impl + 8) = 0;
  std::mutex::mutex((mutex *)0x521680);
  std::mutex::mutex((mutex *)0x521691);
  std::mutex::mutex((mutex *)0x5216a2);
  std::mutex::mutex((mutex *)0x5216b3);
  return;
}

Assistant:

BasicScene::BasicScene()
    : threadAllocators([]() {
          pstd::pmr::memory_resource *baseResource = pstd::pmr::get_default_resource();
#ifdef PBRT_BUILD_GPU_RENDERER
          if (Options->useGPU)
              baseResource = &CUDATrackedMemoryResource::singleton;
#endif
          pstd::pmr::monotonic_buffer_resource *resource =
              new pstd::pmr::monotonic_buffer_resource(1024 * 1024, baseResource);
          return Allocator(resource);
      }) {
}